

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O1

uchar * rsa_pkcs1_signature_string(size_t nbytes,ssh_hashalg *halg,ptrlen data)

{
  long lVar1;
  ulong uVar2;
  uchar *puVar3;
  ssh_hash *psVar4;
  undefined1 *__src;
  size_t __n;
  size_t __n_00;
  
  if (halg == &ssh_sha1) {
    lVar1 = 0x12;
  }
  else {
    lVar1 = 0x16;
    if (halg != &ssh_sha512 && halg != &ssh_sha256) goto LAB_001628f9;
  }
  uVar2 = lVar1 + halg->hlen;
  __n = nbytes - uVar2;
  if (nbytes < uVar2) {
    __assert_fail("nbytes >= fixed_parts",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/rsa.c",
                  0x2d7,
                  "unsigned char *rsa_pkcs1_signature_string(size_t, const ssh_hashalg *, ptrlen)");
  }
  if (halg == &ssh_sha1) {
    __n_00 = 0x10;
    __src = rsa_pkcs1_prefix_for_hash_sha1_asn1_prefix;
  }
  else {
    __n_00 = 0x14;
    if (halg == &ssh_sha256) {
      __src = rsa_pkcs1_prefix_for_hash_sha256_asn1_prefix;
    }
    else {
      if (halg != &ssh_sha512) {
LAB_001628f9:
        __assert_fail("false && \"bad hash algorithm for RSA PKCS#1\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/rsa.c"
                      ,0x2ca,"ptrlen rsa_pkcs1_prefix_for_hash(const ssh_hashalg *)");
      }
      __src = rsa_pkcs1_prefix_for_hash_sha512_asn1_prefix;
    }
  }
  puVar3 = (uchar *)safemalloc(nbytes,1,0);
  puVar3[0] = '\0';
  puVar3[1] = '\x01';
  memset(puVar3 + 2,0xff,__n);
  memcpy(puVar3 + __n + 2,__src,__n_00);
  psVar4 = (*halg->new)(halg);
  if (psVar4 != (ssh_hash *)0x0) {
    (*psVar4->vt->reset)(psVar4);
  }
  BinarySink_put_datapl(psVar4->binarysink_,data);
  (*psVar4->vt->digest)(psVar4,puVar3 + __n + 2 + __n_00);
  (*psVar4->vt->free)(psVar4);
  return puVar3;
}

Assistant:

static unsigned char *rsa_pkcs1_signature_string(
    size_t nbytes, const ssh_hashalg *halg, ptrlen data)
{
    size_t fixed_parts = rsa_pkcs1_length_of_fixed_parts(halg);
    assert(nbytes >= fixed_parts);
    size_t padding = nbytes - fixed_parts;

    ptrlen asn1_prefix = rsa_pkcs1_prefix_for_hash(halg);

    unsigned char *bytes = snewn(nbytes, unsigned char);

    bytes[0] = 0;
    bytes[1] = 1;

    memset(bytes + 2, 0xFF, padding);

    memcpy(bytes + 2 + padding, asn1_prefix.ptr, asn1_prefix.len);

    ssh_hash *h = ssh_hash_new(halg);
    put_datapl(h, data);
    ssh_hash_final(h, bytes + 2 + padding + asn1_prefix.len);

    return bytes;
}